

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

bool __thiscall Json::StyledWriter::hasCommentForValue(StyledWriter *this,Value *value)

{
  bool bVar1;
  undefined1 local_19;
  Value *value_local;
  StyledWriter *this_local;
  
  bVar1 = Value::hasComment(value,commentBefore);
  local_19 = true;
  if (!bVar1) {
    bVar1 = Value::hasComment(value,commentAfterOnSameLine);
    local_19 = true;
    if (!bVar1) {
      local_19 = Value::hasComment(value,commentAfter);
    }
  }
  return local_19;
}

Assistant:

bool 
StyledWriter::hasCommentForValue( const Value &value )
{
   return value.hasComment( commentBefore )
          ||  value.hasComment( commentAfterOnSameLine )
          ||  value.hasComment( commentAfter );
}